

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O2

void elf32_addrelocs(GlobalVars *gv,_func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  char *pcVar1;
  uint32_t name;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  uint be;
  uint32_t offset;
  uint32_t uVar4;
  LinkedSection *ls;
  Reloc *pRVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = elf_endianess == '\x01';
  ls = (LinkedSection *)&gv->lnksec;
  uVar4 = 0;
  while (offset = uVar4, ls = (LinkedSection *)(ls->n).next, (ls->n).next != (node *)0x0) {
    pRVar5 = (Reloc *)&ls->relocs;
    uVar4 = offset;
    while( true ) {
      pRVar5 = (Reloc *)(pRVar5->n).next;
      be = (uint)bVar6;
      if ((pRVar5->n).next == (node *)0x0) break;
      sVar2 = elf_addrela(gv,ls,pRVar5,be,reloclist,reloc_vlink2elf);
      uVar4 = uVar4 + (int)sVar2;
    }
    pRVar5 = (Reloc *)&ls->xrefs;
    while (pRVar5 = (Reloc *)(pRVar5->n).next, (pRVar5->n).next != (node *)0x0) {
      sVar2 = elf_addrela(gv,ls,pRVar5,be,reloclist,reloc_vlink2elf);
      uVar4 = uVar4 + (int)sVar2;
    }
    if (uVar4 - offset != 0) {
      sVar3 = strlen(ls->name);
      __s = (char *)alloc(sVar3 + 6);
      pcVar1 = ".rel";
      if (gv->reloctab_format == '\x02') {
        pcVar1 = ".rela";
      }
      sprintf(__s,".%s%s",pcVar1 + 1,ls->name);
      name = elf_addshdrstr(__s);
      bVar7 = gv->reloctab_format == '\x02';
      elf32_addshdr(name,(uint)!bVar7 * 5 + 4,0,0,offset,uVar4 - offset,0,ls->index,4,
                    (uint)bVar7 * 4 + 8,(uint)bVar6);
    }
  }
  return;
}

Assistant:

static void elf32_addrelocs(struct GlobalVars *gv,
                            uint8_t (*reloc_vlink2elf)(struct Reloc *))
/* creates relocations for all sections */
{
  bool be = elf_endianess == _BIG_ENDIAN_;
  struct LinkedSection *ls;
  struct Reloc *rel;
  uint32_t sroffs=0,roffs=0;

  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    sroffs = roffs;

    /* relocations */
    for (rel=(struct Reloc *)ls->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    /* external references */
    for (rel=(struct Reloc *)ls->xrefs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    if (roffs != sroffs) {
      /* create ".rel(a).name" header */
      char *relname = (char *)alloc(strlen(ls->name)+6);

      sprintf(relname,".%s%s",
              gv->reloctab_format==RTAB_ADDEND ? "rela" : "rel",
              ls->name);
      elf32_addshdr(elf_addshdrstr(relname),
                    gv->reloctab_format==RTAB_ADDEND ? SHT_RELA : SHT_REL,
                    0,0,sroffs,roffs-sroffs,0,(uint32_t)ls->index,4,
                    gv->reloctab_format==RTAB_ADDEND ?
                      sizeof(struct Elf32_Rela) : sizeof(struct Elf32_Rel),
                    be);
      /* sroffs is relative and will be corrected later */
      /* sh_link will be initialized, when .symtab exists */
    }
  }
}